

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void assign_suite::assign_signed_int_with_integer(void)

{
  type_conflict7 local_d58;
  undefined1 local_d4b;
  undefined1 local_d4a [2];
  undefined1 local_d48 [8];
  variable number_19;
  undefined1 local_d0b;
  undefined1 local_d0a [2];
  undefined1 local_d08 [8];
  variable data_29;
  unsigned_long_long local_cd0;
  unsigned_long_long value_29;
  undefined1 local_cbb;
  undefined1 local_cba [2];
  undefined1 local_cb8 [8];
  variable number_18;
  undefined1 local_c7b;
  undefined1 local_c7a [2];
  undefined1 local_c78 [8];
  variable data_28;
  unsigned_long_long local_c40;
  unsigned_long_long value_28;
  undefined1 local_c2e;
  undefined1 local_c2d [2];
  undefined1 local_c2b;
  undefined1 local_c2a [2];
  undefined1 local_c28 [8];
  variable data_27;
  unsigned_long_long local_bf0;
  unsigned_long_long value_27;
  undefined1 local_bdb;
  undefined1 local_bda [2];
  undefined1 local_bd8 [8];
  variable number_17;
  undefined1 local_b9b;
  undefined1 local_b9a [2];
  undefined1 local_b98 [8];
  variable data_26;
  longlong local_b60;
  longlong value_26;
  undefined1 local_b4b;
  undefined1 local_b4a [2];
  undefined1 local_b48 [8];
  variable number_16;
  undefined1 local_b0b;
  undefined1 local_b0a [2];
  undefined1 local_b08 [8];
  variable data_25;
  longlong local_ad0;
  longlong value_25;
  undefined1 local_abe;
  undefined1 local_abd [2];
  undefined1 local_abb;
  undefined1 local_aba [2];
  undefined1 local_ab8 [8];
  variable data_24;
  longlong local_a80;
  longlong value_24;
  undefined1 local_a6b;
  undefined1 local_a6a [2];
  undefined1 local_a68 [8];
  variable number_15;
  undefined1 local_a2b;
  undefined1 local_a2a [2];
  undefined1 local_a28 [8];
  variable data_23;
  unsigned_long local_9f0;
  unsigned_long value_23;
  undefined1 local_9db;
  undefined1 local_9da [2];
  undefined1 local_9d8 [8];
  variable number_14;
  undefined1 local_99b;
  undefined1 local_99a [2];
  undefined1 local_998 [8];
  variable data_22;
  unsigned_long local_960;
  unsigned_long value_22;
  undefined1 local_94e;
  undefined1 local_94d [2];
  undefined1 local_94b;
  undefined1 local_94a [2];
  undefined1 local_948 [8];
  variable data_21;
  unsigned_long local_910;
  unsigned_long value_21;
  undefined1 local_8fb;
  undefined1 local_8fa [2];
  undefined1 local_8f8 [8];
  variable number_13;
  undefined1 local_8bb;
  undefined1 local_8ba [2];
  undefined1 local_8b8 [8];
  variable data_20;
  long local_880;
  long value_20;
  undefined1 local_86b;
  undefined1 local_86a [2];
  undefined1 local_868 [8];
  variable number_12;
  undefined1 local_82b;
  undefined1 local_82a [2];
  undefined1 local_828 [8];
  variable data_19;
  long local_7f0;
  long value_19;
  undefined1 local_7de;
  undefined1 local_7dd [2];
  undefined1 local_7db;
  undefined1 local_7da [2];
  undefined1 local_7d8 [8];
  variable data_18;
  long value_18;
  undefined1 local_798 [8];
  variable number_11;
  undefined1 local_75b;
  undefined1 local_75a [2];
  undefined1 local_758 [8];
  variable data_17;
  type_conflict5 local_720;
  uint value_17;
  undefined1 local_718 [8];
  variable number_10;
  undefined1 local_6db;
  undefined1 local_6da [2];
  undefined1 local_6d8 [8];
  variable data_16;
  uint value_16;
  undefined1 local_69b;
  undefined1 local_69a [2];
  undefined1 local_698 [8];
  variable data_15;
  type_conflict4 local_660;
  uint value_15;
  undefined1 local_658 [8];
  variable number_9;
  undefined1 local_61b;
  undefined1 local_61a [2];
  undefined1 local_618 [8];
  variable data_14;
  type_conflict4 local_5e0;
  int value_14;
  undefined1 local_5d8 [8];
  variable number_8;
  undefined1 local_59b;
  undefined1 local_59a [2];
  undefined1 local_598 [8];
  variable data_13;
  int value_13;
  undefined1 local_55b;
  undefined1 local_55a [2];
  undefined1 local_558 [8];
  variable data_12;
  type_conflict3 local_51e;
  int value_12;
  undefined1 local_518 [8];
  variable number_7;
  undefined1 local_4db;
  undefined1 local_4da [2];
  undefined1 local_4d8 [8];
  variable data_11;
  unsigned_short local_4a0;
  type_conflict3 local_49e;
  undefined1 local_49b;
  undefined1 local_49a [2];
  unsigned_short value_11;
  variable number_6;
  undefined1 local_45b;
  undefined1 local_45a [2];
  undefined1 local_458 [8];
  variable data_10;
  undefined1 local_41e;
  undefined1 local_41d;
  unsigned_short value_10;
  undefined1 local_41a [2];
  undefined1 local_418 [8];
  variable data_9;
  unsigned_short local_3e0;
  type_conflict2 local_3de;
  undefined1 local_3db;
  undefined1 local_3da [2];
  unsigned_short value_9;
  variable number_5;
  undefined1 local_39b;
  undefined1 local_39a [2];
  undefined1 local_398 [8];
  variable data_8;
  short local_360;
  type_conflict2 local_35e;
  undefined1 local_35b;
  undefined1 local_35a [2];
  short value_8;
  variable number_4;
  undefined1 local_31b;
  undefined1 local_31a [2];
  undefined1 local_318 [8];
  variable data_7;
  undefined1 local_2de;
  undefined1 local_2dd;
  short value_7;
  undefined1 local_2da [2];
  undefined1 local_2d8 [8];
  variable data_6;
  short local_2a0;
  type_conflict1 local_29d [2];
  undefined1 local_29b;
  undefined1 local_29a [2];
  short value_6;
  variable number_3;
  undefined1 local_25b;
  undefined1 local_25a [2];
  undefined1 local_258 [8];
  variable data_5;
  uchar local_21e;
  type_conflict1 local_21d [2];
  undefined1 local_21b;
  undefined1 local_21a [2];
  undefined1 local_218 [2];
  uchar value_5;
  variable number_2;
  undefined1 local_1db;
  undefined1 local_1da [2];
  undefined1 local_1d8 [8];
  variable data_4;
  type_conflict1 local_1a0 [2];
  undefined1 local_19e;
  undefined1 local_19d [2];
  undefined1 local_19b;
  undefined1 local_19a;
  uchar value_4;
  undefined1 local_198 [8];
  variable data_3;
  uchar local_15e;
  type_conflict local_15d [2];
  undefined1 local_15b;
  undefined1 local_15a [2];
  undefined1 local_158 [2];
  uchar value_3;
  variable number_1;
  undefined1 local_11b;
  undefined1 local_11a [2];
  undefined1 local_118 [8];
  variable data_2;
  char local_de;
  type_conflict local_dd [2];
  undefined1 local_db;
  undefined1 local_da [2];
  undefined1 local_d8 [2];
  char value_2;
  variable number;
  undefined1 local_9b;
  undefined1 local_9a [2];
  undefined1 local_98 [8];
  variable data_1;
  undefined1 local_5f;
  undefined1 local_5e [4];
  char value_1;
  undefined1 local_4b;
  undefined1 local_4a [2];
  undefined1 local_48 [8];
  variable data;
  char local_d;
  int local_c;
  char value;
  int input;
  
  local_c = 2;
  local_d = '\x02';
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_48,2);
  local_4a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_4b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xb72,"void assign_suite::assign_signed_int_with_integer()",local_4a,&local_4b);
  trial::dynamic::basic_variable<std::allocator<char>>::operator=
            ((basic_variable<std::allocator<char>> *)local_48,local_d);
  local_5e[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<signed_char>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_5f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed char>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xb74,"void assign_suite::assign_signed_int_with_integer()",local_5e,&local_5f);
  data_1.storage._47_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::value<signed_char>
                 ((basic_variable<std::allocator<char>_> *)local_48);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,signed_char,signed_char>
            ("data.value<signed char>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xb75,"void assign_suite::assign_signed_int_with_integer()",&data_1.storage.field_0x2f
             ,&local_d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  data_1.storage._46_1_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_98,local_c);
  local_9a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                          ((basic_variable<std::allocator<char>_> *)local_98);
  local_9b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xb7a,"void assign_suite::assign_signed_int_with_integer()",local_9a,&local_9b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<signed_char>
            ((basic_variable<std::allocator<char>_> *)local_d8,data_1.storage._46_1_);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_98,
             (basic_variable<std::allocator<char>_> *)local_d8);
  local_da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<signed_char>
                          ((basic_variable<std::allocator<char>_> *)local_98);
  local_db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed char>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xb7d,"void assign_suite::assign_signed_int_with_integer()",local_da,&local_db);
  local_dd[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<signed_char>
                          ((basic_variable<std::allocator<char>_> *)local_98);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,signed_char,signed_char>
            ("data.value<signed char>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xb7e,"void assign_suite::assign_signed_int_with_integer()",local_dd,
             &data_1.storage.field_0x2e);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_98);
  local_de = '\x02';
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_118,local_c);
  local_11a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_118);
  local_11b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xb83,"void assign_suite::assign_signed_int_with_integer()",local_11a,&local_11b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<signed_char>
            ((basic_variable<std::allocator<char>_> *)local_158,local_de);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_118,
             (basic_variable<std::allocator<char>_> *)local_158);
  local_15a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<signed_char>
                           ((basic_variable<std::allocator<char>_> *)local_118);
  local_15b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed char>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xb86,"void assign_suite::assign_signed_int_with_integer()",local_15a,&local_15b);
  local_15d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<signed_char>
                           ((basic_variable<std::allocator<char>_> *)local_118);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,signed_char,signed_char>
            ("data.value<signed char>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xb87,"void assign_suite::assign_signed_int_with_integer()",local_15d,&local_de);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_118);
  local_15e = '\x02';
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_198,local_c);
  local_19a = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                        ((basic_variable<std::allocator<char>_> *)local_198);
  local_19b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xb8d,"void assign_suite::assign_signed_int_with_integer()",&local_19a,&local_19b);
  trial::dynamic::basic_variable<std::allocator<char>>::operator=
            ((basic_variable<std::allocator<char>> *)local_198,local_15e);
  local_19d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_char>
                           ((basic_variable<std::allocator<char>_> *)local_198);
  local_19e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned char>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xb8f,"void assign_suite::assign_signed_int_with_integer()",local_19d,&local_19e);
  local_1a0[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_char>
                           ((basic_variable<std::allocator<char>_> *)local_198);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,unsigned_char>
            ("data.value<unsigned char>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xb90,"void assign_suite::assign_signed_int_with_integer()",local_1a0,&local_15e);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_198);
  data_4.storage._47_1_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_1d8,local_c);
  local_1da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_1d8);
  local_1db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xb95,"void assign_suite::assign_signed_int_with_integer()",local_1da,&local_1db);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_char>
            ((basic_variable<std::allocator<char>_> *)local_218,data_4.storage._47_1_);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_1d8,
             (basic_variable<std::allocator<char>_> *)local_218);
  local_21a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_char>
                           ((basic_variable<std::allocator<char>_> *)local_1d8);
  local_21b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned char>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xb98,"void assign_suite::assign_signed_int_with_integer()",local_21a,&local_21b);
  local_21d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_char>
                           ((basic_variable<std::allocator<char>_> *)local_1d8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,unsigned_char>
            ("data.value<unsigned char>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xb99,"void assign_suite::assign_signed_int_with_integer()",local_21d,
             &data_4.storage.field_0x2f);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1d8);
  local_21e = '\x02';
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_258,local_c);
  local_25a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_258);
  local_25b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xb9e,"void assign_suite::assign_signed_int_with_integer()",local_25a,&local_25b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_char>
            ((basic_variable<std::allocator<char>_> *)&value_6,local_21e);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_258,
             (basic_variable<std::allocator<char>_> *)&value_6);
  local_29a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_char>
                           ((basic_variable<std::allocator<char>_> *)local_258);
  local_29b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned char>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xba1,"void assign_suite::assign_signed_int_with_integer()",local_29a,&local_29b);
  local_29d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_char>
                           ((basic_variable<std::allocator<char>_> *)local_258);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,unsigned_char>
            ("data.value<unsigned char>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xba2,"void assign_suite::assign_signed_int_with_integer()",local_29d,&local_21e);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&value_6);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_258);
  local_2a0 = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_2d8,local_c);
  local_2da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_2d8);
  value_7._1_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xba8,"void assign_suite::assign_signed_int_with_integer()",local_2da,
             (long)&value_7 + 1);
  trial::dynamic::basic_variable<std::allocator<char>>::operator=
            ((basic_variable<std::allocator<char>> *)local_2d8,local_2a0);
  local_2dd = trial::dynamic::basic_variable<std::allocator<char>_>::same<short>
                        ((basic_variable<std::allocator<char>_> *)local_2d8);
  local_2de = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed short int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbaa,"void assign_suite::assign_signed_int_with_integer()",&local_2dd,&local_2de);
  data_7.storage._46_2_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::value<short>
                 ((basic_variable<std::allocator<char>_> *)local_2d8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,short>
            ("data.value<signed short int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbab,"void assign_suite::assign_signed_int_with_integer()",&data_7.storage.field_0x2e
             ,&local_2a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_2d8);
  data_7.storage._44_2_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_318,local_c);
  local_31a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_318);
  local_31b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbb0,"void assign_suite::assign_signed_int_with_integer()",local_31a,&local_31b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<short>
            ((basic_variable<std::allocator<char>_> *)&value_8,data_7.storage._44_2_);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_318,
             (basic_variable<std::allocator<char>_> *)&value_8);
  local_35a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<short>
                           ((basic_variable<std::allocator<char>_> *)local_318);
  local_35b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed short int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbb3,"void assign_suite::assign_signed_int_with_integer()",local_35a,&local_35b);
  local_35e = trial::dynamic::basic_variable<std::allocator<char>_>::value<short>
                        ((basic_variable<std::allocator<char>_> *)local_318);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,short>
            ("data.value<signed short int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbb4,"void assign_suite::assign_signed_int_with_integer()",&local_35e,
             &data_7.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&value_8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_318);
  local_360 = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_398,local_c);
  local_39a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_398);
  local_39b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbb9,"void assign_suite::assign_signed_int_with_integer()",local_39a,&local_39b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<short>
            ((basic_variable<std::allocator<char>_> *)&value_9,local_360);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_398,
             (basic_variable<std::allocator<char>_> *)&value_9);
  local_3da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<short>
                           ((basic_variable<std::allocator<char>_> *)local_398);
  local_3db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed short int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbbc,"void assign_suite::assign_signed_int_with_integer()",local_3da,&local_3db);
  local_3de = trial::dynamic::basic_variable<std::allocator<char>_>::value<short>
                        ((basic_variable<std::allocator<char>_> *)local_398);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,short>
            ("data.value<signed short int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbbd,"void assign_suite::assign_signed_int_with_integer()",&local_3de,&local_360);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&value_9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_398);
  local_3e0 = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_418,local_c);
  local_41a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_418);
  value_10._1_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbc3,"void assign_suite::assign_signed_int_with_integer()",local_41a,
             (long)&value_10 + 1);
  trial::dynamic::basic_variable<std::allocator<char>>::operator=
            ((basic_variable<std::allocator<char>> *)local_418,local_3e0);
  local_41d = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_short>
                        ((basic_variable<std::allocator<char>_> *)local_418);
  local_41e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned short int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbc5,"void assign_suite::assign_signed_int_with_integer()",&local_41d,&local_41e);
  data_10.storage._46_2_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_short>
                 ((basic_variable<std::allocator<char>_> *)local_418);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_short,unsigned_short>
            ("data.value<unsigned short int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbc6,"void assign_suite::assign_signed_int_with_integer()",
             &data_10.storage.field_0x2e,&local_3e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_418);
  data_10.storage._44_2_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_458,local_c);
  local_45a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_458);
  local_45b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbcb,"void assign_suite::assign_signed_int_with_integer()",local_45a,&local_45b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_short>
            ((basic_variable<std::allocator<char>_> *)&value_11,data_10.storage._44_2_);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_458,
             (basic_variable<std::allocator<char>_> *)&value_11);
  local_49a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_short>
                           ((basic_variable<std::allocator<char>_> *)local_458);
  local_49b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned short int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbce,"void assign_suite::assign_signed_int_with_integer()",local_49a,&local_49b);
  local_49e = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_short>
                        ((basic_variable<std::allocator<char>_> *)local_458);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_short,unsigned_short>
            ("data.value<unsigned short int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbcf,"void assign_suite::assign_signed_int_with_integer()",&local_49e,
             &data_10.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&value_11);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_458);
  local_4a0 = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_4d8,local_c);
  local_4da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_4d8);
  local_4db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbd4,"void assign_suite::assign_signed_int_with_integer()",local_4da,&local_4db);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_short>
            ((basic_variable<std::allocator<char>_> *)local_518,local_4a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_4d8,
             (basic_variable<std::allocator<char>_> *)local_518);
  value_12._2_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_short>
                 ((basic_variable<std::allocator<char>_> *)local_4d8);
  value_12._1_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned short int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbd7,"void assign_suite::assign_signed_int_with_integer()",(long)&value_12 + 2,
             (long)&value_12 + 1);
  local_51e = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_short>
                        ((basic_variable<std::allocator<char>_> *)local_4d8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_short,unsigned_short>
            ("data.value<unsigned short int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbd8,"void assign_suite::assign_signed_int_with_integer()",&local_51e,&local_4a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_4d8);
  data_12.storage._44_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_558,local_c);
  local_55a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_558);
  local_55b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbde,"void assign_suite::assign_signed_int_with_integer()",local_55a,&local_55b);
  trial::dynamic::basic_variable<std::allocator<char>>::operator=
            ((basic_variable<std::allocator<char>> *)local_558,data_12.storage._44_4_);
  value_13._3_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::same<int>
                 ((basic_variable<std::allocator<char>_> *)local_558);
  value_13._2_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbe0,"void assign_suite::assign_signed_int_with_integer()",(long)&value_13 + 3,
             (long)&value_13 + 2);
  data_13.storage._44_4_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                 ((basic_variable<std::allocator<char>_> *)local_558);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("data.value<signed int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbe1,"void assign_suite::assign_signed_int_with_integer()",
             &data_13.storage.field_0x2c,&data_12.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_558);
  data_13.storage._40_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_598,local_c);
  local_59a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_598);
  local_59b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbe6,"void assign_suite::assign_signed_int_with_integer()",local_59a,&local_59b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_5d8,data_13.storage._40_4_);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_598,
             (basic_variable<std::allocator<char>_> *)local_5d8);
  value_14._2_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::same<int>
                 ((basic_variable<std::allocator<char>_> *)local_598);
  value_14._1_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbe9,"void assign_suite::assign_signed_int_with_integer()",(long)&value_14 + 2,
             (long)&value_14 + 1);
  local_5e0 = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                        ((basic_variable<std::allocator<char>_> *)local_598);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("data.value<signed int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbea,"void assign_suite::assign_signed_int_with_integer()",&local_5e0,
             &data_13.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_5d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_598);
  data_14.storage._44_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_618,local_c);
  local_61a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_618);
  local_61b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbef,"void assign_suite::assign_signed_int_with_integer()",local_61a,&local_61b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_658,data_14.storage._44_4_);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_618,
             (basic_variable<std::allocator<char>_> *)local_658);
  value_15._2_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::same<int>
                 ((basic_variable<std::allocator<char>_> *)local_618);
  value_15._1_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbf2,"void assign_suite::assign_signed_int_with_integer()",(long)&value_15 + 2,
             (long)&value_15 + 1);
  local_660 = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                        ((basic_variable<std::allocator<char>_> *)local_618);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("data.value<signed int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbf3,"void assign_suite::assign_signed_int_with_integer()",&local_660,
             &data_14.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_658);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_618);
  data_15.storage._44_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_698,local_c);
  local_69a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_698);
  local_69b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbf9,"void assign_suite::assign_signed_int_with_integer()",local_69a,&local_69b);
  trial::dynamic::basic_variable<std::allocator<char>>::operator=
            ((basic_variable<std::allocator<char>> *)local_698,data_15.storage._44_4_);
  value_16._3_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_int>
                 ((basic_variable<std::allocator<char>_> *)local_698);
  value_16._2_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbfb,"void assign_suite::assign_signed_int_with_integer()",(long)&value_16 + 3,
             (long)&value_16 + 2);
  data_16.storage._44_4_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_int>
                 ((basic_variable<std::allocator<char>_> *)local_698);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,unsigned_int>
            ("data.value<unsigned int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xbfc,"void assign_suite::assign_signed_int_with_integer()",
             &data_16.storage.field_0x2c,&data_15.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_698);
  data_16.storage._40_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_6d8,local_c);
  local_6da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_6d8);
  local_6db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc01,"void assign_suite::assign_signed_int_with_integer()",local_6da,&local_6db);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            ((basic_variable<std::allocator<char>_> *)local_718,data_16.storage._40_4_);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_6d8,
             (basic_variable<std::allocator<char>_> *)local_718);
  value_17._2_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_int>
                 ((basic_variable<std::allocator<char>_> *)local_6d8);
  value_17._1_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc04,"void assign_suite::assign_signed_int_with_integer()",(long)&value_17 + 2,
             (long)&value_17 + 1);
  local_720 = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_int>
                        ((basic_variable<std::allocator<char>_> *)local_6d8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,unsigned_int>
            ("data.value<unsigned int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc05,"void assign_suite::assign_signed_int_with_integer()",&local_720,
             &data_16.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_718);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_6d8);
  data_17.storage._44_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_758,local_c);
  local_75a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_758);
  local_75b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc0a,"void assign_suite::assign_signed_int_with_integer()",local_75a,&local_75b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            ((basic_variable<std::allocator<char>_> *)local_798,data_17.storage._44_4_);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_758,
             (basic_variable<std::allocator<char>_> *)local_798);
  value_18._6_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_int>
                 ((basic_variable<std::allocator<char>_> *)local_758);
  value_18._5_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc0d,"void assign_suite::assign_signed_int_with_integer()",(long)&value_18 + 6,
             (long)&value_18 + 5);
  value_18._0_4_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_int>
                 ((basic_variable<std::allocator<char>_> *)local_758);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,unsigned_int>
            ("data.value<unsigned int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc0e,"void assign_suite::assign_signed_int_with_integer()",&value_18,
             &data_17.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_798);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_758);
  data_18.storage._40_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_7d8,local_c);
  local_7da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_7d8);
  local_7db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc14,"void assign_suite::assign_signed_int_with_integer()",local_7da,&local_7db);
  trial::dynamic::basic_variable<std::allocator<char>>::operator=
            ((basic_variable<std::allocator<char>> *)local_7d8,data_18.storage._40_8_);
  local_7dd[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long>
                           ((basic_variable<std::allocator<char>_> *)local_7d8);
  local_7de = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc16,"void assign_suite::assign_signed_int_with_integer()",local_7dd,&local_7de);
  value_19 = trial::dynamic::basic_variable<std::allocator<char>_>::value<long>
                       ((basic_variable<std::allocator<char>_> *)local_7d8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("data.value<signed long int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc17,"void assign_suite::assign_signed_int_with_integer()",&value_19,
             &data_18.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_7d8);
  local_7f0 = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_828,local_c);
  local_82a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_828);
  local_82b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc1c,"void assign_suite::assign_signed_int_with_integer()",local_82a,&local_82b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long>
            ((basic_variable<std::allocator<char>_> *)local_868,local_7f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_828,
             (basic_variable<std::allocator<char>_> *)local_868);
  local_86a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long>
                           ((basic_variable<std::allocator<char>_> *)local_828);
  local_86b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc1f,"void assign_suite::assign_signed_int_with_integer()",local_86a,&local_86b);
  value_20 = trial::dynamic::basic_variable<std::allocator<char>_>::value<long>
                       ((basic_variable<std::allocator<char>_> *)local_828);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("data.value<signed long int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc20,"void assign_suite::assign_signed_int_with_integer()",&value_20,&local_7f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_868);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_828);
  local_880 = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_8b8,local_c);
  local_8ba[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_8b8);
  local_8bb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc25,"void assign_suite::assign_signed_int_with_integer()",local_8ba,&local_8bb);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long>
            ((basic_variable<std::allocator<char>_> *)local_8f8,local_880);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_8b8,
             (basic_variable<std::allocator<char>_> *)local_8f8);
  local_8fa[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long>
                           ((basic_variable<std::allocator<char>_> *)local_8b8);
  local_8fb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc28,"void assign_suite::assign_signed_int_with_integer()",local_8fa,&local_8fb);
  value_21 = trial::dynamic::basic_variable<std::allocator<char>_>::value<long>
                       ((basic_variable<std::allocator<char>_> *)local_8b8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("data.value<signed long int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc29,"void assign_suite::assign_signed_int_with_integer()",&value_21,&local_880);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_8f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_8b8);
  local_910 = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_948,local_c);
  local_94a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_948);
  local_94b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc2f,"void assign_suite::assign_signed_int_with_integer()",local_94a,&local_94b);
  trial::dynamic::basic_variable<std::allocator<char>>::operator=
            ((basic_variable<std::allocator<char>> *)local_948,local_910);
  local_94d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_long>
                           ((basic_variable<std::allocator<char>_> *)local_948);
  local_94e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc31,"void assign_suite::assign_signed_int_with_integer()",local_94d,&local_94e);
  value_22 = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_long>
                       ((basic_variable<std::allocator<char>_> *)local_948);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,unsigned_long>
            ("data.value<unsigned long int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc32,"void assign_suite::assign_signed_int_with_integer()",&value_22,&local_910);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_948);
  local_960 = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_998,local_c);
  local_99a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_998);
  local_99b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc37,"void assign_suite::assign_signed_int_with_integer()",local_99a,&local_99b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_long>
            ((basic_variable<std::allocator<char>_> *)local_9d8,local_960);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_998,
             (basic_variable<std::allocator<char>_> *)local_9d8);
  local_9da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_long>
                           ((basic_variable<std::allocator<char>_> *)local_998);
  local_9db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc3a,"void assign_suite::assign_signed_int_with_integer()",local_9da,&local_9db);
  value_23 = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_long>
                       ((basic_variable<std::allocator<char>_> *)local_998);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,unsigned_long>
            ("data.value<unsigned long int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc3b,"void assign_suite::assign_signed_int_with_integer()",&value_23,&local_960);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_9d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_998);
  local_9f0 = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_a28,local_c);
  local_a2a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_a28);
  local_a2b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc40,"void assign_suite::assign_signed_int_with_integer()",local_a2a,&local_a2b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_long>
            ((basic_variable<std::allocator<char>_> *)local_a68,local_9f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_a28,
             (basic_variable<std::allocator<char>_> *)local_a68);
  local_a6a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_long>
                           ((basic_variable<std::allocator<char>_> *)local_a28);
  local_a6b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc43,"void assign_suite::assign_signed_int_with_integer()",local_a6a,&local_a6b);
  value_24 = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_long>
                       ((basic_variable<std::allocator<char>_> *)local_a28);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,unsigned_long>
            ("data.value<unsigned long int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc44,"void assign_suite::assign_signed_int_with_integer()",&value_24,&local_9f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_a68);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_a28);
  local_a80 = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_ab8,local_c);
  local_aba[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_ab8);
  local_abb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc4a,"void assign_suite::assign_signed_int_with_integer()",local_aba,&local_abb);
  trial::dynamic::basic_variable<std::allocator<char>>::operator=
            ((basic_variable<std::allocator<char>> *)local_ab8,local_a80);
  local_abd[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long_long>
                           ((basic_variable<std::allocator<char>_> *)local_ab8);
  local_abe = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed long long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc4c,"void assign_suite::assign_signed_int_with_integer()",local_abd,&local_abe);
  value_25 = trial::dynamic::basic_variable<std::allocator<char>_>::value<long_long>
                       ((basic_variable<std::allocator<char>_> *)local_ab8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_long,long_long>
            ("data.value<signed long long int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc4d,"void assign_suite::assign_signed_int_with_integer()",&value_25,&local_a80);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_ab8);
  local_ad0 = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_b08,local_c);
  local_b0a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_b08);
  local_b0b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc52,"void assign_suite::assign_signed_int_with_integer()",local_b0a,&local_b0b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_long>
            ((basic_variable<std::allocator<char>_> *)local_b48,local_ad0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_b08,
             (basic_variable<std::allocator<char>_> *)local_b48);
  local_b4a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long_long>
                           ((basic_variable<std::allocator<char>_> *)local_b08);
  local_b4b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed long long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc55,"void assign_suite::assign_signed_int_with_integer()",local_b4a,&local_b4b);
  value_26 = trial::dynamic::basic_variable<std::allocator<char>_>::value<long_long>
                       ((basic_variable<std::allocator<char>_> *)local_b08);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_long,long_long>
            ("data.value<signed long long int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc56,"void assign_suite::assign_signed_int_with_integer()",&value_26,&local_ad0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_b48);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_b08);
  local_b60 = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_b98,local_c);
  local_b9a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_b98);
  local_b9b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc5b,"void assign_suite::assign_signed_int_with_integer()",local_b9a,&local_b9b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_long>
            ((basic_variable<std::allocator<char>_> *)local_bd8,local_b60);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_b98,
             (basic_variable<std::allocator<char>_> *)local_bd8);
  local_bda[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long_long>
                           ((basic_variable<std::allocator<char>_> *)local_b98);
  local_bdb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed long long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc5e,"void assign_suite::assign_signed_int_with_integer()",local_bda,&local_bdb);
  value_27 = trial::dynamic::basic_variable<std::allocator<char>_>::value<long_long>
                       ((basic_variable<std::allocator<char>_> *)local_b98);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_long,long_long>
            ("data.value<signed long long int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc5f,"void assign_suite::assign_signed_int_with_integer()",&value_27,&local_b60);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_bd8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_b98);
  local_bf0 = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_c28,local_c);
  local_c2a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_c28);
  local_c2b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc65,"void assign_suite::assign_signed_int_with_integer()",local_c2a,&local_c2b);
  trial::dynamic::basic_variable<std::allocator<char>>::operator=
            ((basic_variable<std::allocator<char>> *)local_c28,local_bf0);
  local_c2d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_long_long>
                           ((basic_variable<std::allocator<char>_> *)local_c28);
  local_c2e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned long long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc67,"void assign_suite::assign_signed_int_with_integer()",local_c2d,&local_c2e);
  value_28 = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_long_long>
                       ((basic_variable<std::allocator<char>_> *)local_c28);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long_long,unsigned_long_long>
            ("data.value<unsigned long long int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc68,"void assign_suite::assign_signed_int_with_integer()",&value_28,&local_bf0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_c28);
  local_c40 = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_c78,local_c);
  local_c7a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_c78);
  local_c7b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc6d,"void assign_suite::assign_signed_int_with_integer()",local_c7a,&local_c7b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_long_long>
            ((basic_variable<std::allocator<char>_> *)local_cb8,local_c40);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_c78,
             (basic_variable<std::allocator<char>_> *)local_cb8);
  local_cba[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_long_long>
                           ((basic_variable<std::allocator<char>_> *)local_c78);
  local_cbb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned long long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc70,"void assign_suite::assign_signed_int_with_integer()",local_cba,&local_cbb);
  value_29 = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_long_long>
                       ((basic_variable<std::allocator<char>_> *)local_c78);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long_long,unsigned_long_long>
            ("data.value<unsigned long long int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc71,"void assign_suite::assign_signed_int_with_integer()",&value_29,&local_c40);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_cb8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_c78);
  local_cd0 = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_d08,local_c);
  local_d0a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_d08);
  local_d0b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc76,"void assign_suite::assign_signed_int_with_integer()",local_d0a,&local_d0b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_long_long>
            ((basic_variable<std::allocator<char>_> *)local_d48,local_cd0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_d08,
             (basic_variable<std::allocator<char>_> *)local_d48);
  local_d4a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_long_long>
                           ((basic_variable<std::allocator<char>_> *)local_d08);
  local_d4b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned long long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc79,"void assign_suite::assign_signed_int_with_integer()",local_d4a,&local_d4b);
  local_d58 = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_long_long>
                        ((basic_variable<std::allocator<char>_> *)local_d08);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long_long,unsigned_long_long>
            ("data.value<unsigned long long int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc7a,"void assign_suite::assign_signed_int_with_integer()",&local_d58,&local_cd0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_d48);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_d08);
  return;
}

Assistant:

void assign_signed_int_with_integer()
{
    signed int input = 2;

    // signed char
    {
        signed char value = 2;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        data = value;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed char>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed char>(), value);
    }
    {
        signed char value = 2;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = number;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed char>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed char>(), value);
    }
    {
        signed char value = 2;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = std::move(number);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed char>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed char>(), value);
    }
    // unsigned char
    {
        unsigned char value = 2U;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        data = value;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned char>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned char>(), value);
    }
    {
        unsigned char value = 2U;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = number;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned char>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned char>(), value);
    }
    {
        unsigned char value = 2U;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = std::move(number);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned char>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned char>(), value);
    }
    // signed short int
    {
        signed short int value = 2;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        data = value;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed short int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed short int>(), value);
    }
    {
        signed short int value = 2;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = number;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed short int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed short int>(), value);
    }
    {
        signed short int value = 2;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = std::move(number);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed short int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed short int>(), value);
    }
    // unsigned short int
    {
        unsigned short int value = 2U;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        data = value;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned short int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned short int>(), value);
    }
    {
        unsigned short int value = 2U;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = number;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned short int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned short int>(), value);
    }
    {
        unsigned short int value = 2U;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = std::move(number);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned short int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned short int>(), value);
    }
    // signed int
    {
        signed int value = 2;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        data = value;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed int>(), value);
    }
    {
        signed int value = 2;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = number;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed int>(), value);
    }
    {
        signed int value = 2;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = std::move(number);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed int>(), value);
    }
    // unsigned int
    {
        unsigned int value = 2U;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        data = value;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned int>(), value);
    }
    {
        unsigned int value = 2U;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = number;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned int>(), value);
    }
    {
        unsigned int value = 2U;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = std::move(number);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned int>(), value);
    }
    // signed long int
    {
        signed long int value = 2L;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        data = value;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed long int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed long int>(), value);
    }
    {
        signed long int value = 2L;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = number;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed long int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed long int>(), value);
    }
    {
        signed long int value = 2L;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = std::move(number);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed long int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed long int>(), value);
    }
    // unsigned long int
    {
        unsigned long int value = 2UL;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        data = value;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned long int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned long int>(), value);
    }
    {
        unsigned long int value = 2UL;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = number;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned long int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned long int>(), value);
    }
    {
        unsigned long int value = 2UL;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = std::move(number);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned long int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned long int>(), value);
    }
    // signed long long int
    {
        signed long long int value = 2LL;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        data = value;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed long long int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed long long int>(), value);
    }
    {
        signed long long int value = 2LL;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = number;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed long long int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed long long int>(), value);
    }
    {
        signed long long int value = 2LL;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = std::move(number);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed long long int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed long long int>(), value);
    }
    // unsigned long long int
    {
        unsigned long long int value = 2ULL;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        data = value;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned long long int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned long long int>(), value);
    }
    {
        unsigned long long int value = 2ULL;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = number;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned long long int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned long long int>(), value);
    }
    {
        unsigned long long int value = 2ULL;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(value);
        data = std::move(number);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned long long int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned long long int>(), value);
    }
}